

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parseSubscriptWithBrackets(StructuralParser *this,Expression *lhs)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Constant *pCVar4;
  SubscriptWithBrackets *expression;
  Expression *pEVar5;
  Context context;
  Context local_98;
  pool_ptr<soul::AST::Expression> local_80;
  pool_ptr<soul::AST::Expression> local_78;
  pool_ptr<soul::AST::Expression> local_70;
  pool_ptr<soul::AST::Expression> local_68;
  Value local_60;
  
  local_98.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_98.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_98.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_98.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_98.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_98.parentScope = this->currentScope;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2b0192);
  if (bVar2) {
    soul::Value::Value(&local_60,0);
    pCVar4 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&this->allocator->pool,&local_98,&local_60);
    soul::Value::~Value(&local_60);
    pcVar1 = (this->super_SOULTokeniser).currentType.text;
    if (pcVar1 == "]") {
LAB_001fabdb:
      local_70.object = (Expression *)0x0;
    }
    else {
      if (pcVar1 != (char *)0x0) {
        iVar3 = strcmp(pcVar1,"]");
        if (iVar3 == 0) goto LAB_001fabdb;
      }
      local_70.object = parseExpression(this,false);
    }
    local_68.object = &pCVar4->super_Expression;
    expression = (SubscriptWithBrackets *)
                 checkAndCreateArrayElementRef(this,&local_98,lhs,&local_68,&local_70);
  }
  else {
    pcVar1 = (this->super_SOULTokeniser).currentType.text;
    if (pcVar1 == "]") {
LAB_001fabbe:
      local_60.type.category = invalid;
      local_60.type.arrayElementCategory = invalid;
      local_60.type.isRef = false;
      local_60.type.isConstant = false;
      local_60.type.primitiveType.type = invalid;
      expression = PoolAllocator::
                   allocate<soul::AST::SubscriptWithBrackets,soul::AST::Context&,soul::AST::Expression&,decltype(nullptr)>
                             (&this->allocator->pool,&local_98,lhs,(void **)&local_60);
    }
    else {
      if (pcVar1 != (char *)0x0) {
        iVar3 = strcmp(pcVar1,"]");
        if (iVar3 == 0) goto LAB_001fabbe;
      }
      pEVar5 = parseExpression(this,false);
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2b0192);
      if (bVar2) {
        pcVar1 = (this->super_SOULTokeniser).currentType.text;
        if (pcVar1 == "]") {
LAB_001fac79:
          local_80.object = (Expression *)0x0;
        }
        else {
          if (pcVar1 != (char *)0x0) {
            iVar3 = strcmp(pcVar1,"]");
            if (iVar3 == 0) goto LAB_001fac79;
          }
          local_80.object = parseExpression(this,false);
        }
        local_78.object = pEVar5;
        expression = (SubscriptWithBrackets *)
                     checkAndCreateArrayElementRef(this,&local_98,lhs,&local_78,&local_80);
      }
      else {
        expression = PoolAllocator::
                     allocate<soul::AST::SubscriptWithBrackets,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                               (&this->allocator->pool,&local_98,lhs,pEVar5);
      }
    }
  }
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if (pcVar1 == "]]") {
LAB_001fac34:
    (this->super_SOULTokeniser).currentType.text = "]";
  }
  else {
    if (pcVar1 != (char *)0x0) {
      iVar3 = strcmp(pcVar1,"]]");
      if (iVar3 == 0) goto LAB_001fac34;
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x285ffb);
  }
  pEVar5 = parseSuffixes(this,&expression->super_Expression);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_98.location.sourceCode.object);
  return pEVar5;
}

Assistant:

AST::Expression& parseSubscriptWithBrackets (AST::Expression& lhs)
    {
        auto context = getContext();
        pool_ptr<AST::Expression> e, end;

        if (matchIf (Operator::colon))
        {
            auto& start = allocate<AST::Constant> (context, Value::createArrayIndex (0));

            if (! matches (Operator::closeBracket))
                end = parseExpression();

            e = checkAndCreateArrayElementRef (context, lhs, start, end);
        }
        else if (matches (Operator::closeBracket))
        {
            e = allocate<AST::SubscriptWithBrackets> (context, lhs, nullptr);
        }
        else
        {
            auto& start = parseExpression();

            if (matchIf (Operator::colon))
            {
                if (! matches (Operator::closeBracket))
                    end = parseExpression();

                e = checkAndCreateArrayElementRef (context, lhs, start, end);
            }
            else
            {
                e = allocate<AST::SubscriptWithBrackets> (context, lhs, start);
            }
        }

        if (matchAndReplaceIf (Operator::closeDoubleBracket, Operator::closeBracket))
            return parseSuffixes (*e);

        expect (Operator::closeBracket);
        return parseSuffixes (*e);
    }